

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expr * __thiscall kratos::Var::r_xor(Var *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Expr *pEVar2;
  undefined1 local_20 [8];
  shared_ptr<kratos::Var> var;
  Var *this_local;
  
  var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])();
  Generator::get_var((Generator *)local_20,(string *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_IRNode)._vptr_IRNode[0xd])();
  pEVar2 = Generator::expr((Generator *)CONCAT44(extraout_var_00,iVar1),UXor,this,(Var *)0x0);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_20);
  return pEVar2;
}

Assistant:

Expr &Var::r_xor() const {
    auto var = generator()->get_var(name);
    return generator()->expr(ExprOp::UXor, const_cast<Var *>(this), nullptr);
}